

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O0

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar11;
  float val_2;
  int l_1;
  float sum_3;
  float *sptr_1;
  int j_5;
  int i_7;
  int z_5;
  float *outptr_4;
  Mat m_12;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int sz;
  int kd;
  int area;
  float sum_2;
  int sx0;
  int j_4;
  int sy0;
  int i_6;
  int sz0;
  int z_4;
  float *outptr_3;
  Mat m_9;
  int q_5;
  int dtailpad;
  int htailpad;
  int wtailpad;
  float val;
  int l;
  float max_value_2;
  float *sptr;
  int j_3;
  int i_5;
  int z_3;
  float *outptr_2;
  Mat m_6;
  int q_4;
  int j_2;
  int i_4;
  int z_2;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outd;
  int outh;
  int outw;
  Option opt_pad;
  Mat bottom_blob_bordered;
  int iw_1;
  int ih_1;
  int id_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  int hk;
  int ih1_1;
  int ih0_1;
  int i_3;
  int dk;
  int id1_1;
  int id0_1;
  int z_1;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  int ih;
  int id;
  float max_value_1;
  int iw1;
  int iw0;
  int j;
  int ih1;
  int ih0;
  int i_2;
  int id1;
  int id0;
  int z;
  float *outptr;
  float *inptr;
  int q_2;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max_value;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_4;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_14;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Allocator *in_stack_ffffffffffffea88;
  allocator_type *in_stack_ffffffffffffea90;
  Mat *pMVar12;
  size_type in_stack_ffffffffffffea98;
  Mat *in_stack_ffffffffffffeaa0;
  Allocator *in_stack_ffffffffffffeb00;
  undefined7 in_stack_ffffffffffffec28;
  undefined1 in_stack_ffffffffffffec2f;
  Mat *in_stack_ffffffffffffec38;
  Pooling3D *in_stack_ffffffffffffec40;
  int local_12a8;
  float local_12a4;
  undefined8 local_12a0;
  undefined8 local_1298;
  undefined8 local_1290;
  undefined4 local_1288;
  Allocator *local_1280;
  undefined4 local_1278;
  undefined4 local_1274;
  undefined4 local_1270;
  undefined4 local_126c;
  undefined4 local_1268;
  undefined8 local_1260;
  long local_1258;
  int local_124c;
  int local_1248;
  int local_1244;
  undefined8 local_1240;
  undefined8 local_1238;
  undefined8 local_1230;
  undefined4 local_1228;
  long local_1220;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined4 local_120c;
  undefined4 local_1208;
  undefined8 local_1200;
  long local_11f8;
  undefined8 local_11f0;
  undefined8 local_11e8;
  undefined8 local_11e0;
  undefined4 local_11d8;
  Allocator *local_11d0;
  undefined4 local_11c8;
  undefined4 local_11c4;
  undefined4 local_11c0;
  undefined4 local_11bc;
  undefined4 local_11b8;
  undefined8 local_11b0;
  int local_11a4;
  undefined8 local_11a0;
  undefined8 local_1198;
  undefined8 local_1190;
  undefined4 local_1188;
  Allocator *local_1180;
  undefined4 local_1178;
  undefined4 local_1174;
  undefined4 local_1170;
  undefined4 local_116c;
  undefined4 local_1168;
  undefined8 local_1160;
  float local_1154;
  int local_1150;
  int local_114c;
  int local_1148;
  int local_1144;
  int local_1140;
  int local_113c;
  int local_1138;
  float local_1134;
  int local_1130;
  int local_112c;
  int local_1128;
  int local_1124;
  int local_1120;
  int local_111c;
  undefined8 local_1118;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined4 local_1100;
  long local_10f8;
  undefined4 local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined4 local_10e4;
  undefined4 local_10e0;
  undefined8 local_10d8;
  long local_10d0;
  undefined8 local_10c8;
  undefined8 local_10c0;
  undefined8 local_10b8;
  undefined4 local_10b0;
  Allocator *local_10a8;
  undefined4 local_10a0;
  undefined4 local_109c;
  undefined4 local_1098;
  undefined4 local_1094;
  undefined4 local_1090;
  undefined8 local_1088;
  int local_107c;
  int local_1078;
  int local_1074;
  int local_1070;
  float local_106c;
  int local_1068;
  float local_1064;
  undefined8 local_1060;
  undefined8 local_1058;
  undefined8 local_1050;
  undefined4 local_1048;
  Allocator *local_1040;
  undefined4 local_1038;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined4 local_102c;
  undefined4 local_1028;
  undefined8 local_1020;
  float *local_1018;
  int local_100c;
  int local_1008;
  int local_1004;
  undefined8 local_1000;
  undefined8 local_ff8;
  undefined8 local_ff0;
  undefined4 local_fe8;
  long local_fe0;
  undefined4 local_fd8;
  undefined4 local_fd4;
  undefined4 local_fd0;
  undefined4 local_fcc;
  undefined4 local_fc8;
  undefined8 local_fc0;
  long local_fb8;
  void *local_fb0;
  int *local_fa8;
  ulong local_fa0;
  int local_f98;
  Allocator *local_f90;
  int local_f88;
  int local_f84;
  int local_f80;
  undefined4 local_f7c;
  int local_f78;
  ulong local_f70;
  int local_f68;
  int local_f64;
  int local_f60;
  int local_f5c;
  int local_f58;
  int local_f54;
  int local_f50;
  int local_f4c;
  reference local_f48;
  vector<int,_std::allocator<int>_> local_f38;
  int local_f1c;
  int local_f18;
  int local_f14;
  int local_f10;
  undefined4 local_f0c;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  ulong local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  Mat local_ec8;
  int local_e80;
  int local_e7c;
  int local_e78;
  float local_e74;
  int local_e64;
  int local_e54;
  int local_e44;
  long local_df8;
  int local_da0;
  int local_d9c;
  int local_d98;
  int local_d94;
  float local_d90;
  int local_d8c;
  int local_d88;
  int local_d84;
  int local_d80;
  int local_d7c;
  int local_d78;
  int local_d74;
  int local_d70;
  int local_d6c;
  undefined8 local_d68;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined4 local_d50;
  long local_d48;
  undefined4 local_d40;
  undefined4 local_d3c;
  undefined4 local_d38;
  undefined4 local_d34;
  undefined4 local_d30;
  undefined8 local_d28;
  long local_d20;
  undefined8 local_d18;
  undefined8 local_d10;
  undefined8 local_d08;
  undefined4 local_d00;
  long local_cf8;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined4 local_ce0;
  undefined8 local_cd8;
  long local_cd0;
  int local_cc4;
  int local_cc0;
  float local_cbc;
  int local_c68;
  int local_c64;
  float local_c60 [4];
  undefined8 local_c50;
  undefined8 local_c48;
  undefined8 local_c40;
  undefined4 local_c38;
  long local_c30;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined8 local_c10;
  float *local_c08;
  int local_c00;
  int local_bfc;
  long local_bf8;
  int local_bf0;
  int local_bec;
  int local_be8;
  int local_be4;
  long *local_bd8;
  long *local_bd0;
  int local_bbc;
  long *local_bb8;
  Mat *local_bb0;
  long *local_ba8;
  long *local_ba0;
  undefined1 local_b7d;
  int local_b7c;
  undefined8 *local_b70;
  undefined1 local_b4d;
  int local_b4c;
  undefined8 *local_b40;
  undefined8 *local_b30;
  undefined8 *local_b20;
  undefined8 *local_af8;
  undefined8 *local_ad8;
  undefined8 *local_ac8;
  undefined8 *local_a98;
  undefined8 *local_a88;
  void **local_a78;
  undefined8 *local_a68;
  undefined8 *local_a58;
  undefined8 *local_a48;
  undefined8 *local_a38;
  undefined8 *local_a28;
  undefined8 *local_a18;
  Mat *local_a08;
  long local_9e8;
  undefined1 local_9d5;
  int local_9d4;
  undefined8 *local_9c8;
  undefined1 local_9b5;
  int local_9b4;
  Mat *local_9b0;
  undefined8 *local_9a8;
  undefined1 local_995;
  int local_994;
  undefined8 *local_988;
  undefined1 local_975;
  int local_974;
  Mat *local_970;
  undefined8 *local_968;
  undefined1 local_955;
  int local_954;
  undefined8 *local_948;
  undefined1 local_935;
  int local_934;
  Mat *local_930;
  void **local_928;
  undefined1 local_8f5;
  int local_8f4;
  undefined8 *local_8e8;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  undefined8 *local_8b8;
  Mat *local_8b0;
  int local_8a4;
  undefined8 *local_8a0;
  undefined8 *local_898;
  int local_88c;
  undefined8 *local_888;
  undefined8 *local_880;
  int local_874;
  void **local_870;
  undefined8 *local_868;
  int local_85c;
  undefined8 *local_858;
  int local_84c;
  undefined8 *local_848;
  int local_83c;
  undefined8 *local_838;
  long *local_830;
  long *local_828;
  Mat *local_820;
  long *local_818;
  long local_810;
  undefined4 local_804;
  long local_800;
  long local_7f8;
  undefined4 local_7ec;
  int local_7e8;
  int local_7e4;
  undefined8 *local_7e0;
  Allocator *local_7a0;
  int local_794;
  ulong local_790;
  void *local_788;
  void **local_770;
  long local_768;
  undefined4 local_75c;
  long local_758;
  long local_750;
  undefined4 local_744;
  int local_740;
  int local_73c;
  undefined8 *local_738;
  Allocator *local_730;
  int local_724;
  ulong local_720;
  void *local_718;
  undefined8 *local_700;
  long local_6f8;
  undefined4 local_6ec;
  long local_6e8;
  long local_6e0;
  undefined4 local_6d4;
  int local_6d0;
  int local_6cc;
  undefined8 *local_6c8;
  Allocator *local_6c0;
  int local_6b4;
  ulong local_6b0;
  void *local_6a8;
  undefined8 *local_690;
  long local_688;
  undefined4 local_67c;
  long local_678;
  long local_670;
  undefined4 local_664;
  int local_660;
  int local_65c;
  undefined8 *local_658;
  long local_650;
  undefined4 local_644;
  long local_640;
  float *local_638;
  undefined4 local_62c;
  int local_628;
  int local_624;
  undefined8 *local_620;
  long local_5e0;
  undefined4 local_5d4;
  long local_5d0;
  long local_5c8;
  undefined4 local_5bc;
  int local_5b8;
  int local_5b4;
  undefined8 *local_5b0;
  undefined4 local_55c;
  long local_558;
  undefined4 local_53c;
  long local_538;
  undefined4 local_52c;
  long local_528;
  undefined4 local_51c;
  long local_518;
  undefined4 local_50c;
  long local_508;
  undefined4 local_4fc;
  long local_4f8;
  undefined4 local_4ec;
  long local_4e8;
  undefined4 local_4dc;
  long local_4d8;
  undefined4 local_4bc;
  long local_4b8;
  int local_420;
  undefined4 local_41c;
  Mat *local_418;
  undefined8 *local_3f8;
  undefined8 *local_3d8;
  undefined8 *local_3b8;
  undefined8 *local_398;
  undefined8 *local_378;
  undefined8 *local_358;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  undefined8 *local_318;
  undefined8 *local_2f8;
  undefined8 *local_298;
  undefined8 *local_278;
  undefined8 *local_238;
  void *local_150;
  void *local_e0;
  Allocator *local_90;
  int local_84;
  ulong local_80;
  void *local_78;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  Allocator *local_60;
  int local_54;
  ulong local_50;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  Allocator *local_30;
  int local_24;
  ulong local_20;
  void *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_be4 = *(int *)((long)in_RSI + 0x2c);
  local_be8 = (int)in_RSI[6];
  local_bec = *(int *)((long)in_RSI + 0x34);
  local_bf0 = (int)in_RSI[7];
  local_bf8 = in_RSI[2];
  iVar4 = (int)(in_stack_ffffffffffffea98 >> 0x20);
  local_bd8 = in_RDX;
  local_bd0 = in_RSI;
  if (*(int *)(in_RDI + 0x104) == 0) {
    if (*(int *)(in_RDI + 0x110) == 0) {
      local_8b0 = &local_ec8;
      local_ec8.data = (void *)0x0;
      local_ec8.refcount = (int *)0x0;
      local_ec8.elemsize = 0;
      local_ec8.elempack = 0;
      local_ec8.allocator = (Allocator *)0x0;
      local_ec8.dims = 0;
      local_ec8.w = 0;
      local_ec8.h = 0;
      local_ec8.d = 0;
      local_ec8.c = 0;
      local_ec8.cstep = 0;
      local_f08 = *in_RCX;
      uStack_f00 = in_RCX[1];
      local_ef8 = in_RCX[2];
      uStack_ef0 = in_RCX[3];
      uStack_ee0 = in_RCX[5];
      local_ed8 = in_RCX[6];
      uStack_ed0 = in_RCX[7];
      local_ee8 = in_RCX[4] & 0xffffffffffffff;
      make_padding(in_stack_ffffffffffffec40,in_stack_ffffffffffffec38,local_8b0,
                   (Option *)CONCAT17(in_stack_ffffffffffffec2f,in_stack_ffffffffffffec28));
      local_bb0 = &local_ec8;
      if (local_ec8.data != (void *)0x0) {
        local_820 = local_bb0;
      }
      if (local_ec8.data != (void *)0x0 && local_ec8.cstep * (long)local_ec8.c != 0) {
        local_be4 = local_ec8.w;
        local_be8 = local_ec8.h;
        local_bec = local_ec8.d;
        local_f10 = (local_ec8.w - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xe0) + 1;
        local_f14 = (local_ec8.h - *(int *)(in_RDI + 0xd8)) / *(int *)(in_RDI + 0xe4) + 1;
        local_f18 = (local_ec8.d - *(int *)(in_RDI + 0xdc)) / *(int *)(in_RDI + 0xe8) + 1;
        Mat::create(in_stack_ffffffffffffeaa0,(int)(in_stack_ffffffffffffea98 >> 0x20),
                    (int)in_stack_ffffffffffffea98,(int)((ulong)in_stack_ffffffffffffea90 >> 0x20),
                    (int)in_stack_ffffffffffffea90,(size_t)in_stack_ffffffffffffea88,
                    in_stack_ffffffffffffeb00);
        local_bb8 = local_bd8;
        bVar11 = true;
        if (*local_bd8 != 0) {
          local_818 = local_bd8;
          bVar11 = local_bd8[8] * (long)(int)local_bd8[7] == 0;
        }
        if (bVar11) {
          local_bbc = -100;
          local_f0c = 1;
        }
        else {
          local_f1c = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8) * *(int *)(in_RDI + 0xdc);
          std::allocator<int>::allocator((allocator<int> *)0x1ac46aa);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeaa0,
                     in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
          std::allocator<int>::~allocator((allocator<int> *)0x1ac46d6);
          local_f48 = std::vector<int,_std::allocator<int>_>::operator[](&local_f38,0);
          local_f4c = 0;
          local_f50 = 0;
          local_f54 = local_be4 - *(int *)(in_RDI + 0xd4);
          local_f58 = local_be8 * local_be4 - local_be4 * *(int *)(in_RDI + 0xd8);
          for (local_f5c = 0; local_f5c < *(int *)(in_RDI + 0xdc); local_f5c = local_f5c + 1) {
            for (local_f60 = 0; local_f60 < *(int *)(in_RDI + 0xd8); local_f60 = local_f60 + 1) {
              for (local_f64 = 0; local_f64 < *(int *)(in_RDI + 0xd4); local_f64 = local_f64 + 1) {
                local_f48[local_f4c] = local_f50;
                local_f4c = local_f4c + 1;
                local_f50 = local_f50 + 1;
              }
              local_f50 = local_f54 + local_f50;
            }
            local_f50 = local_f58 + local_f50;
          }
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_f68 = 0; local_f68 < local_bf0; local_f68 = local_f68 + 1) {
              local_928 = &local_fb0;
              local_930 = &local_ec8;
              local_788 = (void *)((long)local_ec8.data +
                                  local_ec8.cstep * (long)local_f68 * local_ec8.elemsize);
              local_770 = &local_fb0;
              local_4d8 = (long)local_ec8.w * (long)local_ec8.h * local_ec8.elemsize;
              local_f70 = (local_4d8 + 0xfU & 0xfffffffffffffff0) / local_ec8.elemsize;
              local_f88 = local_ec8.dims + -1;
              if (local_ec8.dims == 4) {
                local_f70 = (long)local_ec8.w * (long)local_ec8.h;
              }
              local_948 = &local_1000;
              local_73c = *(int *)((long)local_bd8 + 0x2c);
              local_740 = (int)local_bd8[6];
              local_744 = *(undefined4 *)((long)local_bd8 + 0x34);
              local_fb8 = *local_bd8 + local_bd8[8] * (long)local_f68 * local_bd8[2];
              local_758 = local_bd8[2];
              local_75c = (undefined4)local_bd8[3];
              local_768 = local_bd8[4];
              local_738 = &local_1000;
              local_4e8 = (long)local_73c * (long)local_740 * local_758;
              local_8c8 = &local_1000;
              local_a98 = &local_1000;
              local_f78 = local_ec8.d;
              local_f7c = 1;
              local_f80 = local_ec8.h;
              local_f84 = local_ec8.w;
              local_f90 = local_ec8.allocator;
              local_f98 = local_ec8.elempack;
              local_fa0 = local_ec8.elemsize;
              local_fa8 = (int *)0x0;
              local_4dc = 0x10;
              local_4ec = 0x10;
              local_790 = local_ec8.elemsize;
              local_794 = local_ec8.elempack;
              local_7a0 = local_ec8.allocator;
              local_934 = local_f68;
              local_935 = 1;
              local_954 = local_f68;
              local_955 = 1;
              local_1000 = 0;
              local_ff0 = 0;
              local_fe8 = 0;
              local_fd8 = 0;
              local_fd4 = 0;
              local_fd0 = 0;
              local_fcc = 0;
              local_fc8 = 0;
              local_fc0 = 0;
              local_ff8 = 0;
              local_750 = local_fb8;
              local_2f8 = local_a98;
              local_fe0 = local_768;
              local_fb0 = local_788;
              for (local_1004 = 0; local_1004 < local_f18; local_1004 = local_1004 + 1) {
                for (local_1008 = 0; local_1008 < local_f14; local_1008 = local_1008 + 1) {
                  for (local_100c = 0; local_100c < local_f10; local_100c = local_100c + 1) {
                    local_874 = local_1004 * *(int *)(in_RDI + 0xe8);
                    local_868 = &local_1060;
                    local_870 = &local_fb0;
                    local_78 = (void *)((long)local_fb0 +
                                       (long)local_f84 * (long)local_f80 * (long)local_874 *
                                       local_fa0);
                    local_68 = &local_1060;
                    local_83c = local_1008 * *(int *)(in_RDI + 0xe4);
                    local_838 = &local_1060;
                    local_1018 = (float *)((long)local_78 +
                                          (long)(local_100c * *(int *)(in_RDI + 0xe0)) * 4 +
                                          (long)local_f84 * (long)local_83c * local_fa0);
                    local_a88 = &local_1060;
                    local_1040 = local_f90;
                    local_6c = local_f84;
                    local_70 = local_f80;
                    local_80 = local_fa0;
                    local_84 = local_f98;
                    local_90 = local_f90;
                    local_1060 = 0;
                    local_1050 = 0;
                    local_1048 = 0;
                    local_1038 = 0;
                    local_1034 = 0;
                    local_1030 = 0;
                    local_102c = 0;
                    local_1028 = 0;
                    local_1020 = 0;
                    local_1058 = 0;
                    local_1064 = *local_1018;
                    local_318 = local_a88;
                    for (local_1068 = 0; local_1068 < local_f1c; local_1068 = local_1068 + 1) {
                      local_106c = local_1018[local_f48[local_1068]];
                      pfVar10 = std::max<float>(&local_1064,&local_106c);
                      local_1064 = *pfVar10;
                    }
                    *(float *)(local_fb8 + (long)local_100c * 4) = local_1064;
                  }
                  local_fb8 = local_fb8 + (long)local_f10 * 4;
                }
              }
              local_a78 = &local_fb0;
              local_338 = local_a78;
              if (local_fa8 != (int *)0x0) {
                local_33c = 0xffffffff;
                LOCK();
                local_340 = *local_fa8;
                *local_fa8 = *local_fa8 + -1;
                UNLOCK();
                if (local_340 == 1) {
                  if (local_f90 == (Allocator *)0x0) {
                    local_150 = local_fb0;
                    if (local_fb0 != (void *)0x0) {
                      free(local_fb0);
                    }
                  }
                  else {
                    (*local_f90->_vptr_Allocator[3])(local_f90,local_fb0);
                  }
                }
              }
              local_fb0 = (void *)0x0;
              local_fa0 = 0;
              local_f98 = 0;
              local_f88 = 0;
              local_f84 = 0;
              local_f80 = 0;
              local_f7c = 0;
              local_f78 = 0;
              local_f70 = 0;
              local_fa8 = (int *)0x0;
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0x10c) == 0) {
              local_1070 = 0;
              local_1074 = 0;
              local_1078 = 0;
              if (*(int *)(in_RDI + 0x108) == 0) {
                local_1070 = ((local_ec8.w - *(int *)((long)local_bd0 + 0x2c)) -
                             *(int *)(in_RDI + 0xec)) - *(int *)(in_RDI + 0xf0);
                local_1074 = ((local_ec8.h - (int)local_bd0[6]) - *(int *)(in_RDI + 0xf4)) -
                             *(int *)(in_RDI + 0xf8);
                local_1078 = ((local_ec8.d - *(int *)((long)local_bd0 + 0x34)) -
                             *(int *)(in_RDI + 0xfc)) - *(int *)(in_RDI + 0x100);
              }
              for (local_107c = 0; local_107c < local_bf0; local_107c = local_107c + 1) {
                local_968 = &local_10c8;
                local_970 = &local_ec8;
                local_718 = (void *)((long)local_ec8.data +
                                    local_ec8.cstep * (long)local_107c * local_ec8.elemsize);
                local_700 = &local_10c8;
                local_4f8 = (long)local_ec8.w * (long)local_ec8.h * local_ec8.elemsize;
                local_988 = &local_1118;
                local_6cc = *(int *)((long)local_bd8 + 0x2c);
                local_6d0 = (int)local_bd8[6];
                local_6d4 = *(undefined4 *)((long)local_bd8 + 0x34);
                local_6e0 = *local_bd8 + local_bd8[8] * (long)local_107c * local_bd8[2];
                local_6e8 = local_bd8[2];
                local_6ec = (undefined4)local_bd8[3];
                local_6f8 = local_bd8[4];
                local_6c8 = &local_1118;
                local_508 = (long)local_6cc * (long)local_6d0 * local_6e8;
                local_8d0 = &local_1118;
                local_a68 = &local_1118;
                local_10a8 = local_ec8.allocator;
                local_4fc = 0x10;
                local_50c = 0x10;
                local_720 = local_ec8.elemsize;
                local_724 = local_ec8.elempack;
                local_730 = local_ec8.allocator;
                local_974 = local_107c;
                local_975 = 1;
                local_994 = local_107c;
                local_995 = 1;
                local_1118 = 0;
                local_1108 = 0;
                local_1100 = 0;
                local_10f0 = 0;
                local_10ec = 0;
                local_10e8 = 0;
                local_10e4 = 0;
                local_10e0 = 0;
                local_10d8 = 0;
                local_1110 = 0;
                local_10d0 = local_6e0;
                for (local_111c = 0; local_111c < local_f18; local_111c = local_111c + 1) {
                  local_1120 = local_111c * *(int *)(in_RDI + 0xe8);
                  for (local_1124 = 0; local_1124 < local_f14; local_1124 = local_1124 + 1) {
                    local_1128 = local_1124 * *(int *)(in_RDI + 0xe4);
                    for (local_112c = 0; local_112c < local_f10; local_112c = local_112c + 1) {
                      local_1130 = local_112c * *(int *)(in_RDI + 0xe0);
                      local_1134 = 0.0;
                      local_1138 = 0;
                      for (local_113c = 0; local_113c < *(int *)(in_RDI + 0xdc);
                          local_113c = local_113c + 1) {
                        local_1140 = local_1120 + local_113c;
                        if (*(int *)(in_RDI + 0xfc) <= local_1140) {
                          if ((local_bec - *(int *)(in_RDI + 0x100)) - local_1078 <= local_1140)
                          break;
                          for (local_1144 = 0; local_1144 < *(int *)(in_RDI + 0xd8);
                              local_1144 = local_1144 + 1) {
                            local_1148 = local_1128 + local_1144;
                            if (*(int *)(in_RDI + 0xf4) <= local_1148) {
                              if ((local_be8 - *(int *)(in_RDI + 0xf8)) - local_1074 <= local_1148)
                              break;
                              for (local_114c = 0; local_114c < *(int *)(in_RDI + 0xd4);
                                  local_114c = local_114c + 1) {
                                local_1150 = local_1130 + local_114c;
                                if (*(int *)(in_RDI + 0xec) <= local_1150) {
                                  if ((local_be4 - *(int *)(in_RDI + 0xf0)) - local_1070 <=
                                      local_1150) break;
                                  local_880 = &local_11a0;
                                  local_888 = &local_10c8;
                                  local_48 = (void *)((long)local_718 +
                                                     (long)local_ec8.w * (long)local_ec8.h *
                                                     (long)local_1140 * local_ec8.elemsize);
                                  local_38 = &local_11a0;
                                  local_848 = &local_11a0;
                                  local_1154 = *(float *)((long)local_48 +
                                                         (long)local_1150 * 4 +
                                                         (long)local_ec8.w * (long)local_1148 *
                                                         local_ec8.elemsize);
                                  local_a58 = &local_11a0;
                                  local_1180 = local_ec8.allocator;
                                  local_3c = local_ec8.w;
                                  local_40 = local_ec8.h;
                                  local_50 = local_ec8.elemsize;
                                  local_54 = local_ec8.elempack;
                                  local_60 = local_ec8.allocator;
                                  local_11a0 = 0;
                                  local_1190 = 0;
                                  local_1188 = 0;
                                  local_1178 = 0;
                                  local_1174 = 0;
                                  local_1170 = 0;
                                  local_116c = 0;
                                  local_1168 = 0;
                                  local_1160 = 0;
                                  local_1198 = 0;
                                  local_1134 = local_1154 + local_1134;
                                  local_1138 = local_1138 + 1;
                                  local_88c = local_1140;
                                  local_84c = local_1148;
                                  local_378 = local_a58;
                                }
                              }
                            }
                          }
                        }
                      }
                      *(float *)(local_10d0 + (long)local_112c * 4) = local_1134 / (float)local_1138
                      ;
                    }
                    local_10d0 = local_10d0 + (long)local_f10 * 4;
                  }
                }
                local_a48 = &local_10c8;
                local_10c8 = 0;
                local_10b8 = 0;
                local_10b0 = 0;
                local_10a0 = 0;
                local_109c = 0;
                local_1098 = 0;
                local_1094 = 0;
                local_1090 = 0;
                local_1088 = 0;
                local_10c0 = 0;
                local_398 = local_a48;
                local_358 = local_a68;
                local_10f8 = local_6f8;
              }
            }
            else {
              for (local_11a4 = 0; local_11a4 < local_bf0; local_11a4 = local_11a4 + 1) {
                local_9a8 = &local_11f0;
                local_9b0 = &local_ec8;
                local_6a8 = (void *)((long)local_ec8.data +
                                    local_ec8.cstep * (long)local_11a4 * local_ec8.elemsize);
                local_690 = &local_11f0;
                local_518 = (long)local_ec8.w * (long)local_ec8.h * local_ec8.elemsize;
                local_9c8 = &local_1240;
                local_65c = *(int *)((long)local_bd8 + 0x2c);
                local_660 = (int)local_bd8[6];
                local_664 = *(undefined4 *)((long)local_bd8 + 0x34);
                local_670 = *local_bd8 + local_bd8[8] * (long)local_11a4 * local_bd8[2];
                local_678 = local_bd8[2];
                local_67c = (undefined4)local_bd8[3];
                local_688 = local_bd8[4];
                local_658 = &local_1240;
                local_528 = (long)local_65c * (long)local_660 * local_678;
                local_8d8 = &local_1240;
                local_a38 = &local_1240;
                local_1240 = 0;
                local_1230 = 0;
                local_1228 = 0;
                local_1218 = 0;
                local_1214 = 0;
                local_1210 = 0;
                local_120c = 0;
                local_1208 = 0;
                local_1200 = 0;
                local_1238 = 0;
                local_11f8 = local_670;
                for (local_1244 = 0; local_1244 < local_f18; local_1244 = local_1244 + 1) {
                  for (local_1248 = 0; local_1248 < local_f14; local_1248 = local_1248 + 1) {
                    for (local_124c = 0; local_124c < local_f10; local_124c = local_124c + 1) {
                      local_8a4 = local_1244 * *(int *)(in_RDI + 0xe8);
                      local_898 = &local_12a0;
                      local_8a0 = &local_11f0;
                      local_c = local_ec8.w;
                      local_10 = local_ec8.h;
                      local_18 = (void *)((long)local_6a8 +
                                         (long)local_ec8.w * (long)local_ec8.h * (long)local_8a4 *
                                         local_ec8.elemsize);
                      local_20 = local_ec8.elemsize;
                      local_24 = local_ec8.elempack;
                      local_30 = local_ec8.allocator;
                      local_8 = &local_12a0;
                      local_1280 = local_ec8.allocator;
                      local_85c = local_1248 * *(int *)(in_RDI + 0xe4);
                      local_858 = &local_12a0;
                      local_1258 = (long)local_18 +
                                   (long)(local_124c * *(int *)(in_RDI + 0xe0)) * 4 +
                                   (long)local_ec8.w * (long)local_85c * local_ec8.elemsize;
                      local_a28 = &local_12a0;
                      local_12a0 = 0;
                      local_1290 = 0;
                      local_1288 = 0;
                      local_1278 = 0;
                      local_1274 = 0;
                      local_1270 = 0;
                      local_126c = 0;
                      local_1268 = 0;
                      local_1260 = 0;
                      local_1298 = 0;
                      local_12a4 = 0.0;
                      for (local_12a8 = 0; local_12a8 < local_f1c; local_12a8 = local_12a8 + 1) {
                        local_12a4 = *(float *)(local_1258 + (long)local_f48[local_12a8] * 4) +
                                     local_12a4;
                      }
                      *(float *)(local_11f8 + (long)local_124c * 4) = local_12a4 / (float)local_f1c;
                      local_3d8 = local_a28;
                    }
                    local_11f8 = local_11f8 + (long)local_f10 * 4;
                  }
                }
                local_a18 = &local_11f0;
                local_11d0 = local_ec8.allocator;
                local_51c = 0x10;
                local_52c = 0x10;
                local_6b0 = local_ec8.elemsize;
                local_6b4 = local_ec8.elempack;
                local_6c0 = local_ec8.allocator;
                local_9b4 = local_11a4;
                local_9b5 = 1;
                local_9d4 = local_11a4;
                local_9d5 = 1;
                local_11f0 = 0;
                local_11e0 = 0;
                local_11d8 = 0;
                local_11c8 = 0;
                local_11c4 = 0;
                local_11c0 = 0;
                local_11bc = 0;
                local_11b8 = 0;
                local_11b0 = 0;
                local_11e8 = 0;
                local_3f8 = local_a18;
                local_3b8 = local_a38;
                local_1220 = local_688;
              }
            }
          }
          local_bbc = 0;
          local_f0c = 1;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffea90);
        }
      }
      else {
        local_bbc = -100;
        local_f0c = 1;
      }
      pMVar12 = &local_ec8;
      if (local_ec8.refcount != (int *)0x0) {
        local_41c = 0xffffffff;
        LOCK();
        local_420 = *local_ec8.refcount;
        *local_ec8.refcount = *local_ec8.refcount + -1;
        UNLOCK();
        if (local_420 == 1) {
          local_a08 = pMVar12;
          local_418 = pMVar12;
          if (local_ec8.allocator == (Allocator *)0x0) {
            local_e0 = local_ec8.data;
            if (local_ec8.data != (void *)0x0) {
              free(local_ec8.data);
            }
          }
          else {
            (*(local_ec8.allocator)->_vptr_Allocator[3])(local_ec8.allocator,local_ec8.data);
          }
        }
      }
      pMVar12->data = (void *)0x0;
      pMVar12->elemsize = 0;
      pMVar12->elempack = 0;
      pMVar12->dims = 0;
      pMVar12->w = 0;
      pMVar12->h = 0;
      pMVar12->d = 0;
      pMVar12->c = 0;
      pMVar12->cstep = 0;
      pMVar12->refcount = (int *)0x0;
    }
    else {
      Mat::create(in_stack_ffffffffffffeaa0,iVar4,(int)in_stack_ffffffffffffea98,
                  (int)((ulong)in_stack_ffffffffffffea90 >> 0x20),(int)in_stack_ffffffffffffea90,
                  (size_t)in_stack_ffffffffffffea88,in_stack_ffffffffffffeb00);
      local_ba8 = local_bd8;
      bVar11 = true;
      if (*local_bd8 != 0) {
        local_828 = local_bd8;
        bVar11 = local_bd8[8] * (long)(int)local_bd8[7] == 0;
      }
      if (bVar11) {
        local_bbc = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          for (local_cc4 = 0; local_cc4 < local_bf0; local_cc4 = local_cc4 + 1) {
            local_b70 = &local_d18;
            local_5b4 = *(int *)((long)local_bd0 + 0x2c);
            local_5b8 = (int)local_bd0[6];
            local_5bc = *(undefined4 *)((long)local_bd0 + 0x34);
            local_cd0 = *local_bd0 + local_bd0[8] * (long)local_cc4 * local_bd0[2];
            local_5d0 = local_bd0[2];
            local_5d4 = (undefined4)local_bd0[3];
            local_5e0 = local_bd0[4];
            local_5b0 = &local_d18;
            local_558 = (long)local_5b4 * (long)local_5b8 * local_5d0;
            local_b30 = &local_d18;
            local_ad8 = &local_d18;
            local_8e8 = &local_d68;
            local_7e4 = *(int *)((long)local_bd8 + 0x2c);
            local_7e8 = (int)local_bd8[6];
            local_7ec = *(undefined4 *)((long)local_bd8 + 0x34);
            local_d20 = *local_bd8 + local_bd8[8] * (long)local_cc4 * local_bd8[2];
            local_800 = local_bd8[2];
            local_804 = (undefined4)local_bd8[3];
            local_810 = local_bd8[4];
            local_7e0 = &local_d68;
            local_4b8 = (long)local_7e4 * (long)local_7e8 * local_800;
            local_ce0 = 0;
            local_ce4 = 0;
            local_ce8 = 0;
            local_cec = 0;
            local_d00 = 0;
            local_d08 = 0;
            local_d10 = 0;
            local_d18 = 0;
            local_4bc = 0x10;
            local_55c = 0x10;
            local_8f4 = local_cc4;
            local_8f5 = 1;
            local_b7c = local_cc4;
            local_b7d = 1;
            local_cd8 = 0;
            local_cf0 = 0;
            local_8b8 = &local_d68;
            local_ac8 = &local_d68;
            local_d68 = 0;
            local_d58 = 0;
            local_d50 = 0;
            local_d40 = 0;
            local_d3c = 0;
            local_d38 = 0;
            local_d34 = 0;
            local_d30 = 0;
            local_d28 = 0;
            local_d60 = 0;
            local_7f8 = local_d20;
            local_5c8 = local_cd0;
            local_298 = local_ac8;
            local_278 = local_ad8;
            local_d48 = local_810;
            local_cf8 = local_5e0;
            for (local_d6c = 0; local_d6c < *(int *)(in_RDI + 0x11c); local_d6c = local_d6c + 1) {
              local_d70 = (local_bec * local_d6c) / *(int *)(in_RDI + 0x11c);
              local_d74 = (local_bec * (local_d6c + 1) + *(int *)(in_RDI + 0x11c) + -1) /
                          *(int *)(in_RDI + 0x11c);
              for (local_d78 = 0; local_d78 < *(int *)(in_RDI + 0x118); local_d78 = local_d78 + 1) {
                local_d7c = (local_be8 * local_d78) / *(int *)(in_RDI + 0x118);
                local_d80 = (local_be8 * (local_d78 + 1) + *(int *)(in_RDI + 0x118) + -1) /
                            *(int *)(in_RDI + 0x118);
                for (local_d84 = 0; local_d84 < *(int *)(in_RDI + 0x114); local_d84 = local_d84 + 1)
                {
                  local_d88 = (local_be4 * local_d84) / *(int *)(in_RDI + 0x114);
                  local_d8c = (local_be4 * (local_d84 + 1) + *(int *)(in_RDI + 0x114) + -1) /
                              *(int *)(in_RDI + 0x114);
                  local_d90 = *(float *)(local_cd0 +
                                        (long)(local_d70 * local_be4 * local_be8 +
                                               local_d7c * local_be4 + local_d88) * 4);
                  for (local_d94 = local_d70; local_d94 < local_d74; local_d94 = local_d94 + 1) {
                    for (local_d98 = local_d7c; local_d98 < local_d80; local_d98 = local_d98 + 1) {
                      for (local_d9c = local_d88; local_d9c < local_d8c; local_d9c = local_d9c + 1)
                      {
                        pfVar10 = std::max<float>(&local_d90,
                                                  (float *)(local_cd0 +
                                                           (long)(local_d94 * local_be4 * local_be8
                                                                  + local_d98 * local_be4 +
                                                                 local_d9c) * 4));
                        local_d90 = *pfVar10;
                      }
                    }
                  }
                  *(float *)(local_d20 + (long)local_d84 * 4) = local_d90;
                }
                local_d20 = local_d20 + (long)*(int *)(in_RDI + 0x114) * 4;
              }
            }
          }
        }
        else if (*(int *)(in_RDI + 0xd0) == 1) {
          for (local_da0 = 0; local_da0 < local_bf0; local_da0 = local_da0 + 1) {
            lVar1 = *local_bd0;
            lVar2 = local_bd0[8];
            lVar3 = local_bd0[2];
            local_df8 = *local_bd8 + local_bd8[8] * (long)local_da0 * local_bd8[2];
            for (local_e44 = 0; local_e44 < *(int *)(in_RDI + 0x11c); local_e44 = local_e44 + 1) {
              iVar4 = (local_bec * local_e44) / *(int *)(in_RDI + 0x11c);
              iVar5 = (local_bec * (local_e44 + 1) + *(int *)(in_RDI + 0x11c) + -1) /
                      *(int *)(in_RDI + 0x11c);
              for (local_e54 = 0; local_e54 < *(int *)(in_RDI + 0x118); local_e54 = local_e54 + 1) {
                iVar6 = (local_be8 * local_e54) / *(int *)(in_RDI + 0x118);
                iVar7 = (local_be8 * (local_e54 + 1) + *(int *)(in_RDI + 0x118) + -1) /
                        *(int *)(in_RDI + 0x118);
                for (local_e64 = 0; local_e64 < *(int *)(in_RDI + 0x114); local_e64 = local_e64 + 1)
                {
                  iVar8 = (local_be4 * local_e64) / *(int *)(in_RDI + 0x114);
                  iVar9 = (local_be4 * (local_e64 + 1) + *(int *)(in_RDI + 0x114) + -1) /
                          *(int *)(in_RDI + 0x114);
                  local_e74 = 0.0;
                  for (local_e78 = iVar4; local_e7c = iVar6, local_e78 < iVar5;
                      local_e78 = local_e78 + 1) {
                    for (; local_e80 = iVar8, local_e7c < iVar7; local_e7c = local_e7c + 1) {
                      for (; local_e80 < iVar9; local_e80 = local_e80 + 1) {
                        local_e74 = *(float *)(lVar1 + lVar2 * local_da0 * lVar3 +
                                              (long)(local_e78 * local_be4 * local_be8 +
                                                     local_e7c * local_be4 + local_e80) * 4) +
                                    local_e74;
                      }
                    }
                  }
                  *(float *)(local_df8 + (long)local_e64 * 4) =
                       ((local_e74 / (float)(iVar7 - iVar6)) / (float)(iVar9 - iVar8)) /
                       (float)(iVar5 - iVar4);
                }
                local_df8 = local_df8 + (long)*(int *)(in_RDI + 0x114) * 4;
              }
            }
          }
        }
        local_bbc = 0;
      }
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffeaa0,iVar4,(size_t)in_stack_ffffffffffffea90,
                in_stack_ffffffffffffea88);
    local_ba0 = local_bd8;
    bVar11 = true;
    if (*local_bd8 != 0) {
      local_830 = local_bd8;
      bVar11 = local_bd8[8] * (long)(int)local_bd8[7] == 0;
    }
    if (bVar11) {
      local_bbc = -100;
    }
    else {
      local_bfc = local_be4 * local_be8 * local_bec;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_c00 = 0; local_c00 < local_bf0; local_c00 = local_c00 + 1) {
          local_b40 = &local_c50;
          local_624 = *(int *)((long)local_bd0 + 0x2c);
          local_628 = (int)local_bd0[6];
          local_62c = *(undefined4 *)((long)local_bd0 + 0x34);
          local_c08 = (float *)(*local_bd0 + local_bd0[8] * (long)local_c00 * local_bd0[2]);
          local_640 = local_bd0[2];
          local_644 = (undefined4)local_bd0[3];
          local_650 = local_bd0[4];
          local_620 = &local_c50;
          local_538 = (long)local_624 * (long)local_628 * local_640;
          local_b20 = &local_c50;
          local_af8 = &local_c50;
          local_53c = 0x10;
          local_b4c = local_c00;
          local_b4d = 1;
          local_c50 = 0;
          local_c40 = 0;
          local_c38 = 0;
          local_c28 = 0;
          local_c24 = 0;
          local_c20 = 0;
          local_c1c = 0;
          local_c18 = 0;
          local_c10 = 0;
          local_c48 = 0;
          local_c60[0] = *local_c08;
          local_638 = local_c08;
          local_238 = local_af8;
          local_c30 = local_650;
          for (local_c64 = 0; local_c64 < local_bfc; local_c64 = local_c64 + 1) {
            pfVar10 = std::max<float>(local_c60,local_c08 + local_c64);
            local_c60[0] = *pfVar10;
          }
          local_9e8 = (long)local_c00;
          *(float *)(*local_bd8 + local_9e8 * 4) = local_c60[0];
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_c68 = 0; local_c68 < local_bf0; local_c68 = local_c68 + 1) {
          local_cbc = 0.0;
          for (local_cc0 = 0; local_cc0 < local_bfc; local_cc0 = local_cc0 + 1) {
            local_cbc = *(float *)(*local_bd0 + local_bd0[8] * (long)local_c68 * local_bd0[2] +
                                  (long)local_cc0 * 4) + local_cbc;
          }
          *(float *)(*local_bd8 + (long)local_c68 * 4) = local_cbc / (float)local_bfc;
        }
      }
      local_bbc = 0;
    }
  }
  return local_bbc;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}